

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_1::
GenericUploadRenderTimeCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
::init(GenericUploadRenderTimeCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
       *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  DrawMethod DVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int numBytes;
  int numBytes_00;
  int numBytes_01;
  int numBytes_02;
  int numBytes_03;
  int numBytes_04;
  sbyte sVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  MessageBuilder local_1b0;
  
  RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
  ::init(&this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
         ,ctx);
  pcVar9 = "drawElements";
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
      ).m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) {
    pcVar9 = "drawArrays";
  }
  iVar3 = *(int *)&(this->
                   super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                   ).field_0xcc;
  iVar2 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ::getMinWorkloadSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                    );
  sVar5 = (iVar3 != 1) * '\x03' + 2;
  uVar7 = iVar2 << sVar5;
  iVar3 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ::getMaxWorkloadSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                    );
  uVar8 = iVar3 << sVar5;
  if (this->m_uploadRange != UPLOADRANGE_FULL) {
    uVar7 = ((int)uVar7 >> 1) + 3U & 0xfffffffc;
    uVar8 = ((int)uVar8 >> 1) + 3U & 0xfffffffc;
  }
  local_1b0.m_log =
       ((this->
        super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
        ).super_RenderPerformanceTestBase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  this_00 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Measuring the time used in ");
  std::operator<<((ostream *)this_00,pcVar9);
  std::operator<<((ostream *)this_00," and readPixels call with different rendering workloads.\n");
  std::operator<<((ostream *)this_00,"The ");
  pcVar9 = "vertex attrib";
  if (*(int *)&(this->
               super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
               ).field_0xcc == 1) {
    pcVar9 = "index";
  }
  std::operator<<((ostream *)this_00,pcVar9);
  std::operator<<((ostream *)this_00," buffer ");
  pcVar10 = "";
  pcVar9 = "contents ";
  if (this->m_bufferState == BUFFERSTATE_NEW) {
    pcVar9 = "";
  }
  std::operator<<((ostream *)this_00,pcVar9);
  std::operator<<((ostream *)this_00,"sourced by the rendering command ");
  if (this->m_bufferState == BUFFERSTATE_NEW) {
    pcVar9 = "is uploaded ";
  }
  else if (this->m_uploadRange == UPLOADRANGE_FULL) {
    pcVar9 = "are specified ";
  }
  else {
    pcVar9 = (char *)0x0;
    if (this->m_uploadRange == UPLOADRANGE_PARTIAL) {
      pcVar9 = "are updated (partial upload) ";
    }
  }
  std::operator<<((ostream *)this_00,pcVar9);
  std::operator<<((ostream *)this_00,"just before issuing the rendering command.\n");
  pcVar9 = "The buffer is generated just before uploading.\n";
  if (this->m_bufferState == BUFFERSTATE_EXISTING) {
    pcVar9 = "The buffer has been used in rendering.\n";
  }
  std::operator<<((ostream *)this_00,pcVar9);
  std::operator<<((ostream *)this_00,"Buffer ");
  if (this->m_bufferState == BUFFERSTATE_NEW) {
    pcVar9 = "is uploaded";
  }
  else if (this->m_uploadRange == UPLOADRANGE_FULL) {
    pcVar9 = "contents are specified";
  }
  else {
    pcVar9 = (char *)0x0;
    if (this->m_uploadRange == UPLOADRANGE_PARTIAL) {
      pcVar9 = "contents are partially updated";
    }
  }
  std::operator<<((ostream *)this_00,pcVar9);
  std::operator<<((ostream *)this_00," with ");
  pcVar9 = "mapBufferRange";
  if (this->m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA) {
    pcVar9 = "bufferSubData";
  }
  pcVar6 = "bufferData";
  if (this->m_uploadMethod != UPLOADMETHOD_BUFFER_DATA) {
    pcVar6 = pcVar9;
  }
  std::operator<<((ostream *)this_00,pcVar6);
  std::operator<<((ostream *)this_00," command. Usage of the target buffer is DYNAMIC_DRAW.\n");
  pcVar9 = 
  "Mapping buffer with bits MAP_WRITE_BIT | MAP_INVALIDATE_RANGE_BIT | MAP_INVALIDATE_BUFFER_BIT | MAP_UNSYNCHRONIZED_BIT\n"
  ;
  if (this->m_uploadMethod != UPLOADMETHOD_MAP_BUFFER_RANGE) {
    pcVar9 = "";
  }
  std::operator<<((ostream *)this_00,pcVar9);
  pcVar9 = 
  "Uploading an unrelated buffer just before issuing the rendering command with bufferData.\n";
  if (this->m_unrelatedBufferType != UNRELATEDBUFFERTYPE_VERTEX) {
    pcVar9 = "";
  }
  std::operator<<((ostream *)this_00,pcVar9);
  std::ostream::operator<<
            (this_00,(int)(((long)(this->
                                  super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                                  ).m_results.
                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->
                                 super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                                 ).m_results.
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>::SampleResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x50));
  std::operator<<((ostream *)this_00," test samples. Sample order is randomized.\n");
  std::operator<<((ostream *)this_00,
                  "All samples at even positions (first = 0) are tested before samples at odd positions.\n"
                 );
  std::operator<<((ostream *)this_00,
                  "Generated workload is multiple viewport-covering grids with varying number of cells, each cell is two separate triangles.\n"
                 );
  std::operator<<((ostream *)this_00,"Workload sizes are in the range [");
  iVar4 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ::getMinWorkloadSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                    );
  std::ostream::operator<<(this_00,iVar4);
  std::operator<<((ostream *)this_00,",  ");
  iVar4 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ::getMaxWorkloadSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                    );
  std::ostream::operator<<(this_00,iVar4);
  std::operator<<((ostream *)this_00,"] vertices ");
  std::operator<<((ostream *)this_00,"([");
  iVar4 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ::getMinWorkloadSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                    );
  (anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1d0,(_anonymous_namespace_ *)(ulong)(uint)(iVar4 << 5),numBytes);
  std::operator<<((ostream *)this_00,(string *)&local_1d0);
  std::operator<<((ostream *)this_00,",");
  iVar4 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ::getMaxWorkloadSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                    );
  (anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1f0,(_anonymous_namespace_ *)(ulong)(uint)(iVar4 << 5),numBytes_00);
  std::operator<<((ostream *)this_00,(string *)&local_1f0);
  std::operator<<((ostream *)this_00,"] to be processed).\n");
  std::operator<<((ostream *)this_00,"Upload sizes are in the range [");
  (anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_210,(_anonymous_namespace_ *)(ulong)uVar7,numBytes_01);
  std::operator<<((ostream *)this_00,(string *)&local_210);
  std::operator<<((ostream *)this_00,",");
  (anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_230,(_anonymous_namespace_ *)(ulong)uVar8,numBytes_02);
  std::operator<<((ostream *)this_00,(string *)&local_230);
  std::operator<<((ostream *)this_00,"].\n");
  DVar1 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ).m_drawMethod;
  if (DVar1 == DRAWMETHOD_DRAW_ELEMENTS) {
    (anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
              (&local_290,(_anonymous_namespace_ *)(ulong)(uint)(iVar2 << 5),numBytes_03);
    std::operator+(&local_270,"Unrelated upload sizes are in the range [",&local_290);
    std::operator+(&local_250,&local_270,", ");
    (anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
              (&local_2b0,(_anonymous_namespace_ *)(ulong)(uint)(iVar3 << 5),numBytes_04);
    std::operator+(&local_2f0,&local_250,&local_2b0);
    std::operator+(&local_2d0,&local_2f0,"]\n");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"",(allocator<char> *)&local_2f0);
  }
  std::operator<<((ostream *)this_00,(string *)&local_2d0);
  std::operator<<((ostream *)this_00,"Test result is the approximated processing rate in MiB / s.\n"
                 );
  std::operator<<((ostream *)this_00,
                  "Note that while upload time is measured, the time used is not included in the results.\n"
                 );
  pcVar9 = 
  "Note that the data size and the time used in the unrelated upload is not included in the results.\n"
  ;
  if (this->m_unrelatedBufferType != UNRELATEDBUFFERTYPE_VERTEX) {
    pcVar9 = "";
  }
  std::operator<<((ostream *)this_00,pcVar9);
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
      ).m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    pcVar10 = "Note that index array size is not included in the processed size.\n";
  }
  std::operator<<((ostream *)this_00,pcVar10);
  std::operator<<((ostream *)this_00,
                  "Note! Test result may not be useful as is but instead should be compared against the reference.* group and other upload_and_draw.* group results.\n"
                 );
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_2d0);
  if (DVar1 == DRAWMETHOD_DRAW_ELEMENTS) {
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
  }
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  iVar3 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  return iVar3;
}

Assistant:

void GenericUploadRenderTimeCase<SampleType>::init (void)
{
	// init parent
	RenderCase<SampleType>::init();

	// log
	{
		const char* const	targetFunctionName		= (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) ? ("drawArrays") : ("drawElements");
		const int			perVertexSize			= (m_targetBuffer == TARGETBUFFER_INDEX) ? ((int)sizeof(deUint32)) : ((int)sizeof(tcu::Vec4[2]));
		const int			fullMinUploadSize		= RenderCase<SampleType>::getMinWorkloadSize() * perVertexSize;
		const int			fullMaxUploadSize		= RenderCase<SampleType>::getMaxWorkloadSize() * perVertexSize;
		const int			minUploadSize			= (m_uploadRange == UPLOADRANGE_FULL) ? (fullMinUploadSize) : (deAlign32(fullMinUploadSize/2, 4));
		const int			maxUploadSize			= (m_uploadRange == UPLOADRANGE_FULL) ? (fullMaxUploadSize) : (deAlign32(fullMaxUploadSize/2, 4));
		const int			minUnrelatedUploadSize	= RenderCase<SampleType>::getMinWorkloadSize() * (int)sizeof(tcu::Vec4[2]);
		const int			maxUnrelatedUploadSize	= RenderCase<SampleType>::getMaxWorkloadSize() * (int)sizeof(tcu::Vec4[2]);

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Measuring the time used in " << targetFunctionName << " and readPixels call with different rendering workloads.\n"
			<< "The "
				<< ((m_targetBuffer == TARGETBUFFER_INDEX) ? ("index") : ("vertex attrib"))
				<< " buffer "
				<< ((m_bufferState == BUFFERSTATE_NEW) ? ("") : ("contents "))
				<< "sourced by the rendering command "
				<< ((m_bufferState == BUFFERSTATE_NEW)		? ("is uploaded ") :
					(m_uploadRange == UPLOADRANGE_FULL)		? ("are specified ") :
					(m_uploadRange == UPLOADRANGE_PARTIAL)	? ("are updated (partial upload) ") :
					((const char*)DE_NULL))
				<< "just before issuing the rendering command.\n"
			<< ((m_bufferState == BUFFERSTATE_EXISTING) ? ("The buffer has been used in rendering.\n") : ("The buffer is generated just before uploading.\n"))
			<< "Buffer "
				<< ((m_bufferState == BUFFERSTATE_NEW)		? ("is uploaded") :
					(m_uploadRange == UPLOADRANGE_FULL)		? ("contents are specified") :
					(m_uploadRange == UPLOADRANGE_PARTIAL)	? ("contents are partially updated") :
					((const char*)DE_NULL))
				<< " with "
				<< ((m_uploadMethod == UPLOADMETHOD_BUFFER_DATA) ? ("bufferData") : (m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA) ? ("bufferSubData") : ("mapBufferRange"))
				<< " command. Usage of the target buffer is DYNAMIC_DRAW.\n"
			<< ((m_uploadMethod == UPLOADMETHOD_MAP_BUFFER_RANGE) ? ("Mapping buffer with bits MAP_WRITE_BIT | MAP_INVALIDATE_RANGE_BIT | MAP_INVALIDATE_BUFFER_BIT | MAP_UNSYNCHRONIZED_BIT\n") : (""))
			<< ((m_unrelatedBufferType == UNRELATEDBUFFERTYPE_VERTEX) ? ("Uploading an unrelated buffer just before issuing the rendering command with bufferData.\n") : (""))
			<< RenderCase<SampleType>::getNumSamples() << " test samples. Sample order is randomized.\n"
			<< "All samples at even positions (first = 0) are tested before samples at odd positions.\n"
			<< "Generated workload is multiple viewport-covering grids with varying number of cells, each cell is two separate triangles.\n"
			<< "Workload sizes are in the range ["
				<< RenderCase<SampleType>::getMinWorkloadSize() << ",  "
				<< RenderCase<SampleType>::getMaxWorkloadSize() << "] vertices "
				<< "(["
				<< getHumanReadableByteSize(RenderCase<SampleType>::getMinWorkloadDataSize()) << ","
				<< getHumanReadableByteSize(RenderCase<SampleType>::getMaxWorkloadDataSize()) << "] to be processed).\n"
			<< "Upload sizes are in the range ["
				<< getHumanReadableByteSize(minUploadSize) << ","
				<< getHumanReadableByteSize(maxUploadSize) << "].\n"
			<< ((m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) ?
				("Unrelated upload sizes are in the range [" + getHumanReadableByteSize(minUnrelatedUploadSize) + ", " + getHumanReadableByteSize(maxUnrelatedUploadSize) + "]\n") :
				(""))
			<< "Test result is the approximated processing rate in MiB / s.\n"
			<< "Note that while upload time is measured, the time used is not included in the results.\n"
			<< ((m_unrelatedBufferType == UNRELATEDBUFFERTYPE_VERTEX) ? ("Note that the data size and the time used in the unrelated upload is not included in the results.\n") : (""))
			<< ((m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) ? ("Note that index array size is not included in the processed size.\n") : (""))
			<< "Note! Test result may not be useful as is but instead should be compared against the reference.* group and other upload_and_draw.* group results.\n"
			<< tcu::TestLog::EndMessage;
	}
}